

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.h
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::Statistics::~Statistics(Statistics *this)

{
  undefined8 *in_RDI;
  
  (*(code *)**(undefined8 **)*in_RDI)();
  (*(code *)**(undefined8 **)in_RDI[1])();
  (*(code *)**(undefined8 **)in_RDI[2])();
  (*(code *)**(undefined8 **)in_RDI[3])();
  (*(code *)**(undefined8 **)in_RDI[4])();
  (*(code *)**(undefined8 **)in_RDI[5])();
  (*(code *)**(undefined8 **)in_RDI[6])();
  (*(code *)**(undefined8 **)in_RDI[7])();
  (*(code *)**(undefined8 **)in_RDI[8])();
  (*(code *)**(undefined8 **)in_RDI[9])();
  (*(code *)**(undefined8 **)in_RDI[10])();
  spx_free<soplex::Timer*>((Timer **)0x419161);
  spx_free<soplex::Timer*>((Timer **)0x41916f);
  spx_free<soplex::Timer*>((Timer **)0x41917d);
  spx_free<soplex::Timer*>((Timer **)0x41918b);
  spx_free<soplex::Timer*>((Timer **)0x419199);
  spx_free<soplex::Timer*>((Timer **)0x4191a7);
  spx_free<soplex::Timer*>((Timer **)0x4191b5);
  spx_free<soplex::Timer*>((Timer **)0x4191c3);
  spx_free<soplex::Timer*>((Timer **)0x4191d1);
  spx_free<soplex::Timer*>((Timer **)0x4191df);
  spx_free<soplex::Timer*>((Timer **)0x4191ed);
  return;
}

Assistant:

~Statistics()
   {
      // we need to free all timers again (allocation happens in constructor)
      readingTime->~Timer();
      solvingTime->~Timer();
      preprocessingTime->~Timer();
      simplexTime->~Timer();
      syncTime->~Timer();
      transformTime->~Timer();
      rationalTime->~Timer();
      initialPrecisionTime->~Timer();
      extendedPrecisionTime->~Timer();
      reconstructionTime->~Timer();
      boostingStepTime->~Timer();
      spx_free(readingTime);
      spx_free(solvingTime);
      spx_free(preprocessingTime);
      spx_free(simplexTime);
      spx_free(syncTime);
      spx_free(transformTime);
      spx_free(rationalTime);
      spx_free(initialPrecisionTime);
      spx_free(extendedPrecisionTime);
      spx_free(reconstructionTime);
      spx_free(boostingStepTime);
   }